

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O2

int32_t __thiscall
icu_63::CollationRuleParser::parseUnicodeSet
          (CollationRuleParser *this,int32_t i,UnicodeSet *set,UErrorCode *errorCode)

{
  short sVar1;
  UnicodeString *pUVar2;
  char16_t cVar3;
  int32_t iVar4;
  int32_t iVar5;
  int limit;
  char *reason;
  int iVar6;
  UnicodeString local_70;
  
  iVar6 = 0;
  iVar4 = i;
  while( true ) {
    pUVar2 = this->rules;
    sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (pUVar2->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    if (iVar4 == iVar5) break;
    limit = iVar4 + 1;
    cVar3 = UnicodeString::doCharAt(pUVar2,iVar4);
    iVar4 = limit;
    if (cVar3 == L']') {
      iVar6 = iVar6 + -1;
      if (iVar6 == 0) {
        UnicodeString::tempSubStringBetween(&local_70,this->rules,i,limit);
        UnicodeSet::applyPattern(set,&local_70,errorCode);
        UnicodeString::~UnicodeString(&local_70);
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar4 = skipWhiteSpace(this,limit);
          pUVar2 = this->rules;
          sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar5 = (pUVar2->fUnion).fFields.fLength;
          }
          else {
            iVar5 = (int)sVar1 >> 5;
          }
          if ((iVar4 == iVar5) || (cVar3 = UnicodeString::doCharAt(pUVar2,iVar4), cVar3 != L']')) {
            reason = "missing option-terminating \']\' after UnicodeSet pattern";
LAB_0024974b:
            setParseError(this,reason,errorCode);
          }
          else {
            iVar4 = iVar4 + 1;
          }
        }
        else {
          *errorCode = U_ZERO_ERROR;
          setParseError(this,"not a valid UnicodeSet pattern",errorCode);
        }
        return iVar4;
      }
    }
    else if (cVar3 == L'[') {
      iVar6 = iVar6 + 1;
    }
  }
  reason = "unbalanced UnicodeSet pattern brackets";
  goto LAB_0024974b;
}

Assistant:

int32_t
CollationRuleParser::parseUnicodeSet(int32_t i, UnicodeSet &set, UErrorCode &errorCode) {
    // Collect a UnicodeSet pattern between a balanced pair of [brackets].
    int32_t level = 0;
    int32_t j = i;
    for(;;) {
        if(j == rules->length()) {
            setParseError("unbalanced UnicodeSet pattern brackets", errorCode);
            return j;
        }
        UChar c = rules->charAt(j++);
        if(c == 0x5b) {  // '['
            ++level;
        } else if(c == 0x5d) {  // ']'
            if(--level == 0) { break; }
        }
    }
    set.applyPattern(rules->tempSubStringBetween(i, j), errorCode);
    if(U_FAILURE(errorCode)) {
        errorCode = U_ZERO_ERROR;
        setParseError("not a valid UnicodeSet pattern", errorCode);
        return j;
    }
    j = skipWhiteSpace(j);
    if(j == rules->length() || rules->charAt(j) != 0x5d) {
        setParseError("missing option-terminating ']' after UnicodeSet pattern", errorCode);
        return j;
    }
    return ++j;
}